

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *this,SolveData *x)

{
  bool bVar1;
  SolveData *pSVar2;
  unsigned_long uVar3;
  SolveData *in_RSI;
  SolveData *in_RDI;
  DeleteObject deleter;
  
  pSVar2 = get((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x130fe6);
  if ((in_RSI != pSVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)
                       0x130ffc), bVar1)) {
    release((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  uVar3 = set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  (in_RDI->en).ptr_ = uVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}